

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O1

TValue * luaH_setstr(lua_State *L,Table *t,TString *key)

{
  TValue *pTVar1;
  TValue k;
  Value local_10;
  undefined4 local_8;
  
  pTVar1 = &t->node[~(-1 << (t->lsizenode & 0x1f)) & (key->tsv).hash].i_val;
  do {
    if (((((Node *)pTVar1)->i_key).nk.tt == 4) &&
       ((((Node *)pTVar1)->i_key).nk.value.gc == (GCObject *)key)) goto LAB_00114c2e;
    pTVar1 = *(TValue **)((long)&((Node *)pTVar1)->i_key + 0x10);
  } while ((Node *)pTVar1 != (Node *)0x0);
  pTVar1 = &luaO_nilobject_;
LAB_00114c2e:
  if (pTVar1 == &luaO_nilobject_) {
    local_8 = 4;
    local_10 = (Value)key;
    pTVar1 = newkey(L,t,(TValue *)&local_10);
  }
  return pTVar1;
}

Assistant:

TValue *luaH_setstr (lua_State *L, Table *t, TString *key) {
  const TValue *p = luaH_getstr(t, key);
  if (p != luaO_nilobject)
    return cast(TValue *, p);
  else {
    TValue k;
    setsvalue(L, &k, key);
    return newkey(L, t, &k);
  }
}